

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

void __thiscall LiteScript::String::String(String *this,char c)

{
  char c_local;
  String *this_local;
  
  std::__cxx11::u32string::u32string((u32string *)this);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  operator+=(&this->str,(int)c);
  return;
}

Assistant:

LiteScript::String::String(char c) { this->str += (char32_t)c; }